

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Yolov3DetectionOutput_x86_avx::forward
          (Yolov3DetectionOutput_x86_avx *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
  __last;
  __normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
  __first;
  ulong uVar4;
  size_type sVar5;
  float *pfVar6;
  size_type sVar7;
  reference pvVar8;
  reference this_00;
  reference pvVar9;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  double dVar10;
  undefined1 auVar11 [32];
  float *outptr;
  float score;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  size_t z;
  size_t i_2;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *box_bbox_rects;
  int i_1;
  BBoxRect c;
  float area;
  float bbox_ymax;
  float bbox_xmax;
  float bbox_ymin;
  float bbox_xmin;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  float confidence;
  int q;
  float *end;
  float *ptr;
  float class_score;
  int class_index;
  int j;
  int i;
  __m256i vi;
  int cs;
  Mat scores;
  float *box_score_ptr;
  float *hptr;
  float *wptr;
  float *yptr;
  float *xptr;
  float bias_h;
  float bias_w;
  int biases_index;
  int p;
  int pp;
  int net_h;
  int net_w;
  size_t mask_offset;
  int channels_per_box;
  int channels;
  int h;
  int w;
  Mat *bottom_top_blobs;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  all_box_bbox_rects;
  size_t b;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *in_stack_fffffffffffffaa0;
  Mat *in_stack_fffffffffffffaa8;
  value_type *in_stack_fffffffffffffab0;
  undefined7 in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffabf;
  size_type in_stack_fffffffffffffac0;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  *in_stack_fffffffffffffac8;
  Mat *this_01;
  Mat *in_stack_fffffffffffffad0;
  float in_stack_fffffffffffffae4;
  float in_stack_fffffffffffffae8;
  float in_stack_fffffffffffffaec;
  float in_stack_fffffffffffffaf0;
  float in_stack_fffffffffffffaf4;
  float in_stack_fffffffffffffaf8;
  float in_stack_fffffffffffffafc;
  const_iterator in_stack_fffffffffffffb00;
  int local_454;
  size_type local_438;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_430;
  undefined1 local_418 [32];
  BBoxRect *local_3f8;
  BBoxRect *local_3f0;
  BBoxRect *local_3e8;
  reference local_3d8;
  int local_3cc;
  float local_3c8;
  float local_3c4;
  float local_3c0;
  float local_3bc;
  float local_3b8;
  float local_3b4;
  int local_3b0;
  float local_3ac;
  float local_3a8;
  float local_3a4;
  float local_3a0;
  float local_39c;
  float local_398;
  float local_394;
  float local_390;
  float local_38c;
  float local_388;
  int local_384;
  float *local_380;
  float *local_378;
  float local_370;
  int local_36c;
  int local_368;
  int local_364;
  BBoxRect *local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  int local_334;
  long local_330;
  int local_2f0;
  Mat local_2e8;
  float *local_2a0;
  Mat local_298;
  float *local_250;
  Mat local_248;
  float *local_200;
  Mat local_1f8;
  float *local_1b0;
  Mat local_1a8;
  float *local_160;
  float local_154;
  float local_150;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  long local_138;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  const_reference local_118;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_100;
  ulong local_e8;
  undefined1 local_e0 [60];
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  uint local_94;
  int local_90;
  int local_8c;
  int local_88;
  undefined4 local_84;
  undefined1 local_80 [32];
  undefined4 local_50;
  int local_4c;
  int local_48;
  int local_44;
  uint local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_e0._32_8_ = in_RDX;
  local_e0._40_8_ = in_RSI;
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            *)0x6f409c);
  for (local_e8 = 0; uVar4 = local_e8,
      sVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_e0._40_8_),
      uVar4 < sVar5; local_e8 = local_e8 + 1) {
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)0x6f40ee);
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
    local_118 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_e0._40_8_,local_e8
                          );
    local_11c = local_118->w;
    local_120 = local_118->h;
    local_124 = local_118->c;
    local_128 = local_124 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
    if (local_128 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) + 5) {
      local_138 = local_e8 * (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      pfVar6 = ncnn::Mat::operator[]
                         ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x170),local_e8);
      local_13c = (int)(*pfVar6 * (float)local_11c);
      pfVar6 = ncnn::Mat::operator[]
                         ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x170),local_e8);
      local_140 = (int)(*pfVar6 * (float)local_120);
      for (local_144 = 0; local_144 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_144 = local_144 + 1) {
        local_148 = local_144 * local_128;
        pfVar6 = ncnn::Mat::operator[]
                           ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x128),
                            local_144 + local_138);
        local_14c = (int)*pfVar6;
        pfVar6 = ncnn::Mat::operator[]
                           ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0),
                            (long)(local_14c * 2));
        local_150 = *pfVar6;
        pfVar6 = ncnn::Mat::operator[]
                           ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0),
                            (long)(local_14c * 2 + 1));
        local_154 = *pfVar6;
        ncnn::Mat::channel(in_stack_fffffffffffffad0,(int)((ulong)in_stack_fffffffffffffac8 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_1a8);
        ncnn::Mat::~Mat((Mat *)0x6f4409);
        local_160 = pfVar6;
        ncnn::Mat::channel(in_stack_fffffffffffffad0,(int)((ulong)in_stack_fffffffffffffac8 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_1f8);
        ncnn::Mat::~Mat((Mat *)0x6f445d);
        local_1b0 = pfVar6;
        ncnn::Mat::channel(in_stack_fffffffffffffad0,(int)((ulong)in_stack_fffffffffffffac8 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_248);
        ncnn::Mat::~Mat((Mat *)0x6f44b2);
        local_200 = pfVar6;
        ncnn::Mat::channel(in_stack_fffffffffffffad0,(int)((ulong)in_stack_fffffffffffffac8 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_298);
        ncnn::Mat::~Mat((Mat *)0x6f4507);
        local_250 = pfVar6;
        ncnn::Mat::channel(in_stack_fffffffffffffad0,(int)((ulong)in_stack_fffffffffffffac8 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_2e8);
        ncnn::Mat::~Mat((Mat *)0x6f455c);
        local_2a0 = pfVar6;
        ncnn::Mat::channel_range
                  (in_stack_fffffffffffffad0,(int)((ulong)in_stack_fffffffffffffac8 >> 0x20),
                   (int)in_stack_fffffffffffffac8);
        local_334 = local_2f0;
        local_8c = local_2f0 * 2;
        local_90 = local_2f0 * 3;
        local_94 = local_2f0 << 2;
        local_98 = local_2f0 * 5;
        local_9c = local_2f0 * 6;
        local_a0 = local_2f0 * 7;
        local_84 = 0;
        local_88 = local_2f0;
        local_4c = local_2f0;
        local_50 = 0;
        auVar2 = vpinsrd_avx(ZEXT416(local_94),local_98,1);
        auVar2 = vpinsrd_avx(auVar2,local_9c,2);
        auVar2 = vpinsrd_avx(auVar2,local_a0,3);
        auVar3 = vpinsrd_avx(ZEXT416(0),local_2f0,1);
        auVar3 = vpinsrd_avx(auVar3,local_8c,2);
        auVar3 = vpinsrd_avx(auVar3,local_90,3);
        auVar11._16_16_ = auVar2;
        auVar11._0_16_ = auVar3;
        local_80._0_8_ = auVar3._0_8_;
        local_80._8_8_ = auVar3._8_8_;
        local_80._16_8_ = auVar2._0_8_;
        local_80._24_8_ = auVar2._8_8_;
        local_360 = (BBoxRect *)local_80._0_8_;
        uStack_358 = local_80._8_8_;
        uStack_350 = local_80._16_8_;
        uStack_348 = local_80._24_8_;
        in_stack_fffffffffffffb00._M_current = (BBoxRect *)local_80._0_8_;
        local_80 = auVar11;
        local_48 = local_8c;
        local_44 = local_90;
        local_40 = local_94;
        local_3c = local_98;
        local_38 = local_9c;
        local_34 = local_a0;
        for (local_364 = 0; local_364 < local_120; local_364 = local_364 + 1) {
          for (local_368 = 0; local_368 < local_11c; local_368 = local_368 + 1) {
            local_36c = 0;
            local_370 = -3.4028235e+38;
            local_378 = (float *)(local_330 + (long)(local_364 * local_11c) * 4 +
                                 (long)local_368 * 4);
            local_380 = local_378 +
                        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) * local_334;
            local_384 = 0;
            for (; local_378 < local_380; local_378 = local_378 + local_334) {
              if (local_370 < *local_378) {
                local_36c = local_384;
                local_370 = *local_378;
              }
              local_384 = local_384 + 1;
            }
            dVar10 = std::exp((double)((ulong)(uint)*local_2a0 ^ 0x8000000080000000));
            in_stack_fffffffffffffafc = SUB84(dVar10,0);
            dVar10 = std::exp((double)((ulong)(uint)local_370 ^ 0x8000000080000000));
            in_stack_fffffffffffffaf8 = SUB84(dVar10,0);
            local_388 = 1.0 / (in_stack_fffffffffffffafc * (in_stack_fffffffffffffaf8 + 1.0) + 1.0);
            if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) <= local_388) {
              in_stack_fffffffffffffaf0 = (float)local_368;
              in_stack_fffffffffffffaf4 = sigmoid(0.0);
              local_38c = (in_stack_fffffffffffffaf0 + in_stack_fffffffffffffaf4) / (float)local_11c
              ;
              in_stack_fffffffffffffae8 = (float)local_364;
              in_stack_fffffffffffffaec = sigmoid(0.0);
              local_390 = (in_stack_fffffffffffffae8 + in_stack_fffffffffffffaec) / (float)local_120
              ;
              dVar10 = std::exp((double)(ulong)(uint)*local_200);
              in_stack_fffffffffffffae4 = SUB84(dVar10,0);
              local_394 = (in_stack_fffffffffffffae4 * local_150) / (float)local_13c;
              dVar10 = std::exp((double)(ulong)(uint)*local_250);
              local_398 = (SUB84(dVar10,0) * local_154) / (float)local_140;
              local_3c4 = local_38c - local_394 * 0.5;
              local_3c0 = local_390 - local_398 * 0.5;
              local_3bc = local_38c + local_394 * 0.5;
              local_3b8 = local_390 + local_398 * 0.5;
              local_3b4 = local_394 * local_398;
              local_3c8 = local_388;
              local_3b0 = local_36c;
              local_3ac = local_3b4;
              local_3a8 = local_3b8;
              local_3a4 = local_3bc;
              local_3a0 = local_3c0;
              local_39c = local_3c4;
              std::
              vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              ::operator[](&local_100,(long)local_144);
              std::
              vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),
                          in_stack_fffffffffffffab0);
            }
            local_160 = local_160 + 1;
            local_1b0 = local_1b0 + 1;
            local_200 = local_200 + 1;
            local_250 = local_250 + 1;
            local_2a0 = local_2a0 + 1;
          }
        }
        ncnn::Mat::~Mat((Mat *)0x6f4d34);
      }
      for (local_3cc = 0; local_3cc < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_3cc = local_3cc + 1) {
        local_3d8 = std::
                    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ::operator[](&local_100,(long)local_3cc);
        in_stack_fffffffffffffad0 = (Mat *)local_e0;
        local_3e8 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::end(in_stack_fffffffffffffaa0);
        __gnu_cxx::
        __normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>
        ::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect*>
                  ((__normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
                    *)in_stack_fffffffffffffaa8,
                   (__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
                    *)in_stack_fffffffffffffaa0);
        local_3f0 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::begin(in_stack_fffffffffffffaa0);
        local_3f8 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::end(in_stack_fffffffffffffaa0);
        __first._M_current._4_4_ = in_stack_fffffffffffffafc;
        __first._M_current._0_4_ = in_stack_fffffffffffffaf8;
        __last._M_current._4_4_ = in_stack_fffffffffffffaf4;
        __last._M_current._0_4_ = in_stack_fffffffffffffaf0;
        local_418._24_8_ =
             std::
             vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
             ::
             insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                       ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                        in_stack_fffffffffffffb00,__first,__last);
      }
      local_12c = 0;
    }
    else {
      local_a4 = -1;
      local_12c = 1;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8));
    if (local_12c != 0) goto LAB_006f5215;
  }
  Yolov3DetectionOutput::qsort_descent_inplace
            ((Yolov3DetectionOutput *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),
             (vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              *)in_stack_fffffffffffffab0);
  this_01 = (Mat *)local_418;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x6f4ec3);
  Yolov3DetectionOutput::nms_sorted_bboxes
            ((Yolov3DetectionOutput *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
             (vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),in_stack_fffffffffffffae4
            );
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            *)0x6f4f02);
  local_438 = 0;
  while (sVar5 = local_438,
        sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_418),
        sVar5 < sVar7) {
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_418,local_438
                       );
    std::
    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ::operator[]((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                  *)local_e0,*pvVar8);
    std::
    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),
                in_stack_fffffffffffffab0);
    local_438 = local_438 + 1;
  }
  sVar7 = std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          ::size(&local_430);
  if ((int)sVar7 == 0) {
    local_a4 = 0;
  }
  else {
    this_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_e0._32_8_,0);
    ncnn::Mat::create(this_01,(int)(sVar5 >> 0x20),(int)sVar5,
                      CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),
                      (Allocator *)in_stack_fffffffffffffab0);
    in_stack_fffffffffffffabf = ncnn::Mat::empty(in_stack_fffffffffffffaa8);
    if ((bool)in_stack_fffffffffffffabf) {
      local_a4 = -100;
    }
    else {
      for (local_454 = 0; local_454 < (int)sVar7; local_454 = local_454 + 1) {
        pvVar9 = std::
                 vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ::operator[](&local_430,(long)local_454);
        fVar1 = pvVar9->score;
        pfVar6 = ncnn::Mat::row(this_00,local_454);
        *pfVar6 = (float)(pvVar9->label + 1);
        pfVar6[1] = fVar1;
        pfVar6[2] = pvVar9->xmin;
        pfVar6[3] = pvVar9->ymin;
        pfVar6[4] = pvVar9->xmax;
        pfVar6[5] = pvVar9->ymax;
      }
      local_a4 = 0;
    }
  }
  local_12c = 1;
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::~vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
             *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8));
LAB_006f5215:
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::~vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
             *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8));
  return local_a4;
}

Assistant:

int Yolov3DetectionOutput_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = scores.cstep;

#if __AVX__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}